

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
::_find_key<phmap::priv::NonStandardLayout>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           *this,NonStandardLayout *key,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  bool bVar21;
  size_t sVar22;
  int iVar23;
  size_t unaff_RBP;
  ulong uVar24;
  slot_type *a;
  long lVar25;
  uint uVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i match;
  long local_68;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  
  sVar22 = 0xffffffffffffffff;
  if (this->ctrl_ != (ctrl_t *)0x0) {
    uVar2 = this->capacity_;
    if ((uVar2 + 1 & uVar2) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar24 = hashval >> 7 & uVar2;
    auVar28 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar28 = pshuflw(auVar28,auVar28,0);
    local_68 = 0;
    do {
      pcVar1 = this->ctrl_ + uVar24;
      cVar5 = *pcVar1;
      cVar6 = pcVar1[1];
      cVar7 = pcVar1[2];
      cVar8 = pcVar1[3];
      cVar9 = pcVar1[4];
      cVar10 = pcVar1[5];
      cVar11 = pcVar1[6];
      cVar12 = pcVar1[7];
      cVar13 = pcVar1[8];
      cVar14 = pcVar1[9];
      cVar15 = pcVar1[10];
      cVar16 = pcVar1[0xb];
      cVar17 = pcVar1[0xc];
      cVar18 = pcVar1[0xd];
      cVar19 = pcVar1[0xe];
      cVar20 = pcVar1[0xf];
      local_48 = auVar28[0];
      cStack_47 = auVar28[1];
      cStack_46 = auVar28[2];
      cStack_45 = auVar28[3];
      auVar29[0] = -(local_48 == cVar5);
      auVar29[1] = -(cStack_47 == cVar6);
      auVar29[2] = -(cStack_46 == cVar7);
      auVar29[3] = -(cStack_45 == cVar8);
      auVar29[4] = -(local_48 == cVar9);
      auVar29[5] = -(cStack_47 == cVar10);
      auVar29[6] = -(cStack_46 == cVar11);
      auVar29[7] = -(cStack_45 == cVar12);
      auVar29[8] = -(local_48 == cVar13);
      auVar29[9] = -(cStack_47 == cVar14);
      auVar29[10] = -(cStack_46 == cVar15);
      auVar29[0xb] = -(cStack_45 == cVar16);
      auVar29[0xc] = -(local_48 == cVar17);
      auVar29[0xd] = -(cStack_47 == cVar18);
      auVar29[0xe] = -(cStack_46 == cVar19);
      auVar29[0xf] = -(cStack_45 == cVar20);
      uVar4 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf;
      iVar23 = 4;
      bVar27 = uVar4 == 0;
      sVar22 = unaff_RBP;
      if (!bVar27) {
        uVar26 = (uint)uVar4;
        uVar3 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        sVar22 = uVar3 + uVar24 & uVar2;
        a = this->slots_ + sVar22;
        while (bVar21 = operator==(&a->key,key), !bVar21) {
          uVar26 = uVar26 - 1 & uVar26;
          bVar27 = uVar26 == 0;
          if (bVar27) {
            iVar23 = 4;
            sVar22 = unaff_RBP;
            goto LAB_0018a99d;
          }
          uVar3 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          sVar22 = uVar3 + uVar24 & uVar2;
          a = this->slots_ + sVar22;
        }
        iVar23 = 1;
      }
LAB_0018a99d:
      if (bVar27) {
        auVar30[0] = -(cVar5 == -0x80);
        auVar30[1] = -(cVar6 == -0x80);
        auVar30[2] = -(cVar7 == -0x80);
        auVar30[3] = -(cVar8 == -0x80);
        auVar30[4] = -(cVar9 == -0x80);
        auVar30[5] = -(cVar10 == -0x80);
        auVar30[6] = -(cVar11 == -0x80);
        auVar30[7] = -(cVar12 == -0x80);
        auVar30[8] = -(cVar13 == -0x80);
        auVar30[9] = -(cVar14 == -0x80);
        auVar30[10] = -(cVar15 == -0x80);
        auVar30[0xb] = -(cVar16 == -0x80);
        auVar30[0xc] = -(cVar17 == -0x80);
        auVar30[0xd] = -(cVar18 == -0x80);
        auVar30[0xe] = -(cVar19 == -0x80);
        auVar30[0xf] = -(cVar20 == -0x80);
        iVar23 = 3;
        if ((((((((((((((((auVar30 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar30 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar30 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar30 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar30 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar30 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar30 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar30 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar30 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar30 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar30 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar30 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar30 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar30 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar30 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar30[0xf]
           ) {
          lVar25 = uVar24 + local_68;
          local_68 = local_68 + 0x10;
          uVar24 = lVar25 + 0x10U & uVar2;
          iVar23 = 0;
        }
      }
      unaff_RBP = sVar22;
    } while (iVar23 == 0);
    if (iVar23 == 3) {
      sVar22 = 0xffffffffffffffff;
    }
  }
  return sVar22;
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }